

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawColumnHorizPalCommand::Execute(DrawColumnHorizPalCommand *this,DrawerThread *thread)

{
  uint uVar1;
  uint8_t *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int x;
  uint8_t *source;
  fixed_t frac;
  fixed_t fracstep;
  uint8_t *dest;
  int count;
  DrawerThread *thread_local;
  DrawColumnHorizPalCommand *this_local;
  
  uVar3 = DrawerThread::count_for_thread
                    (thread,(this->super_PalColumnHorizCommand)._yl,
                     (this->super_PalColumnHorizCommand)._count);
  if (0 < (int)uVar3) {
    iVar5 = (this->super_PalColumnHorizCommand)._iscale;
    iVar6 = (this->super_PalColumnHorizCommand)._texturefrac;
    puVar2 = (this->super_PalColumnHorizCommand)._source;
    uVar1 = (this->super_PalColumnHorizCommand)._x;
    _frac = thread->dc_temp;
    iVar4 = DrawerThread::temp_line_for_thread(thread,(this->super_PalColumnHorizCommand)._yl);
    _frac = _frac + (int)((uVar1 & 3) + iVar4 * 4);
    iVar4 = DrawerThread::skipped_by_thread(thread,(this->super_PalColumnHorizCommand)._yl);
    source._0_4_ = iVar5 * iVar4 + iVar6;
    iVar5 = thread->num_cores * iVar5;
    if ((uVar3 & 1) != 0) {
      *_frac = puVar2[(int)source >> 0x10];
      _frac = _frac + 4;
      source._0_4_ = iVar5 + (int)source;
    }
    if ((uVar3 & 2) != 0) {
      *_frac = puVar2[(int)source >> 0x10];
      _frac[4] = puVar2[iVar5 + (int)source >> 0x10];
      source._0_4_ = iVar5 + iVar5 + (int)source;
      _frac = _frac + 8;
    }
    if ((uVar3 & 4) != 0) {
      *_frac = puVar2[(int)source >> 0x10];
      _frac[4] = puVar2[iVar5 + (int)source >> 0x10];
      iVar6 = iVar5 + iVar5 + (int)source;
      _frac[8] = puVar2[iVar6 >> 0x10];
      iVar6 = iVar5 + iVar6;
      _frac[0xc] = puVar2[iVar6 >> 0x10];
      source._0_4_ = iVar5 + iVar6;
      _frac = _frac + 0x10;
    }
    for (iVar6 = (int)uVar3 >> 3; iVar6 != 0; iVar6 = iVar6 + -1) {
      *_frac = puVar2[(int)source >> 0x10];
      _frac[4] = puVar2[iVar5 + (int)source >> 0x10];
      iVar4 = iVar5 + iVar5 + (int)source;
      _frac[8] = puVar2[iVar4 >> 0x10];
      iVar4 = iVar5 + iVar4;
      _frac[0xc] = puVar2[iVar4 >> 0x10];
      iVar4 = iVar5 + iVar4;
      _frac[0x10] = puVar2[iVar4 >> 0x10];
      iVar4 = iVar5 + iVar4;
      _frac[0x14] = puVar2[iVar4 >> 0x10];
      iVar4 = iVar5 + iVar4;
      _frac[0x18] = puVar2[iVar4 >> 0x10];
      iVar4 = iVar5 + iVar4;
      _frac[0x1c] = puVar2[iVar4 >> 0x10];
      source._0_4_ = iVar5 + iVar4;
      _frac = _frac + 0x20;
    }
  }
  return;
}

Assistant:

void DrawColumnHorizPalCommand::Execute(DrawerThread *thread)
	{
		int count = _count;
		uint8_t *dest;
		fixed_t fracstep;
		fixed_t frac;

		count = thread->count_for_thread(_yl, count);
		if (count <= 0)
			return;

		fracstep = _iscale;
		frac = _texturefrac;

		const uint8_t *source = _source;

		int x = _x & 3;
		dest = &thread->dc_temp[x + thread->temp_line_for_thread(_yl) * 4];
		frac += fracstep * thread->skipped_by_thread(_yl);
		fracstep *= thread->num_cores;

		if (count & 1) {
			*dest = source[frac >> FRACBITS]; dest += 4; frac += fracstep;
		}
		if (count & 2) {
			dest[0] = source[frac >> FRACBITS]; frac += fracstep;
			dest[4] = source[frac >> FRACBITS]; frac += fracstep;
			dest += 8;
		}
		if (count & 4) {
			dest[0] = source[frac >> FRACBITS]; frac += fracstep;
			dest[4] = source[frac >> FRACBITS]; frac += fracstep;
			dest[8] = source[frac >> FRACBITS]; frac += fracstep;
			dest[12] = source[frac >> FRACBITS]; frac += fracstep;
			dest += 16;
		}
		count >>= 3;
		if (!count) return;

		do
		{
			dest[0] = source[frac >> FRACBITS]; frac += fracstep;
			dest[4] = source[frac >> FRACBITS]; frac += fracstep;
			dest[8] = source[frac >> FRACBITS]; frac += fracstep;
			dest[12] = source[frac >> FRACBITS]; frac += fracstep;
			dest[16] = source[frac >> FRACBITS]; frac += fracstep;
			dest[20] = source[frac >> FRACBITS]; frac += fracstep;
			dest[24] = source[frac >> FRACBITS]; frac += fracstep;
			dest[28] = source[frac >> FRACBITS]; frac += fracstep;
			dest += 32;
		} while (--count);
	}